

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::SliceExpr::~SliceExpr(SliceExpr *this)

{
  SliceExpr *in_RDI;
  
  ~SliceExpr(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

SliceExpr(const Location & loc, std::shared_ptr<Expression> && s, std::shared_ptr<Expression> && e)
      : Expression(loc), start(std::move(s)), end(std::move(e)) {}